

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__high_bit(uint z)

{
  int n;
  uint z_local;
  undefined4 local_4;
  
  n = 0;
  if (z == 0) {
    local_4 = -1;
  }
  else {
    z_local = z;
    if (0xffff < z) {
      n = 0x10;
      z_local = z >> 0x10;
    }
    if (0xff < z_local) {
      n = n + 8;
      z_local = z_local >> 8;
    }
    if (0xf < z_local) {
      n = n + 4;
      z_local = z_local >> 4;
    }
    if (3 < z_local) {
      n = n + 2;
      z_local = z_local >> 2;
    }
    if (1 < z_local) {
      n = n + 1;
    }
    local_4 = n;
  }
  return local_4;
}

Assistant:

static int stbi__high_bit(unsigned int z)
{
   int n=0;
   if (z == 0) return -1;
   if (z >= 0x10000) { n += 16; z >>= 16; }
   if (z >= 0x00100) { n +=  8; z >>=  8; }
   if (z >= 0x00010) { n +=  4; z >>=  4; }
   if (z >= 0x00004) { n +=  2; z >>=  2; }
   if (z >= 0x00002) { n +=  1;/* >>=  1;*/ }
   return n;
}